

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::alloc
          (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
           *this,int new_len)

{
  CRuleCondition *p;
  uint uVar1;
  int iVar2;
  CRuleCondition *pCVar3;
  long lVar4;
  
  this->list_size = new_len;
  pCVar3 = allocator_default<CTilesetMapper::CRuleCondition>::alloc_array(new_len);
  uVar1 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar1 = this->num_elements;
  }
  lVar4 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (; p = this->list, (ulong)uVar1 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    *(undefined4 *)((long)&pCVar3->m_Value + lVar4) = *(undefined4 *)((long)&p->m_Value + lVar4);
    *(undefined8 *)((long)&pCVar3->m_X + lVar4) = *(undefined8 *)((long)&p->m_X + lVar4);
  }
  allocator_default<CTilesetMapper::CRuleCondition>::free_array(p);
  iVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar2 = this->num_elements;
  }
  this->num_elements = iVar2;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}